

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_key_update(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  byte *pbVar1;
  int ret;
  uint8_t *end;
  uint8_t *src;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  pbVar1 = message.base + 4;
  if ((message.base + (message.len - (long)pbVar1) == (uint8_t *)0x1) && (*pbVar1 < 2)) {
    message_local.len._4_4_ = update_traffic_key(tls,0);
    if (message_local.len._4_4_ == 0) {
      if (*pbVar1 != 0) {
        if (tls->ctx->update_traffic_key != (ptls_update_traffic_key_t *)0x0) {
          return 10;
        }
        tls->field_0x160 = tls->field_0x160 & 0xf7 | 8;
      }
      message_local.len._4_4_ = 0;
    }
  }
  else {
    message_local.len._4_4_ = 0x32;
  }
  return message_local.len._4_4_;
}

Assistant:

static int handle_key_update(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret;

    /* validate */
    if (end - src != 1 || *src > 1)
        return PTLS_ALERT_DECODE_ERROR;

    /* update receive key */
    if ((ret = update_traffic_key(tls, 0)) != 0)
        return ret;

    if (*src) {
        if (tls->ctx->update_traffic_key != NULL)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        tls->needs_key_update = 1;
    }

    return 0;
}